

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

Tree * new_tree(List *list)

{
  Token *pTVar1;
  void *pvVar2;
  Tree *pTVar3;
  undefined8 *puVar4;
  
  pvVar2 = malloc(0x18);
  pTVar3 = (Tree *)require_not_null(pvVar2,"Failed to allocate space");
  pvVar2 = malloc(0x10);
  puVar4 = (undefined8 *)require_not_null(pvVar2,"Failed to allocate space");
  puVar4[1] = 0;
  *puVar4 = tree_eval;
  pTVar1 = (Token *)puVar4[1];
  (pTVar3->node).eval = (eval_handler_)*puVar4;
  (pTVar3->node).token = pTVar1;
  pTVar3->stmts = list;
  return pTVar3;
}

Assistant:

Tree *new_tree(List *list) {
    Tree *tree = new(Tree);
    tree->node = tree_node_(NULL,eval_handler(tree_eval));
    tree->stmts = list;
    return tree;
}